

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Performance::uniformNiv(Functions *gl,int n,int location,int count,int *data)

{
  int *data_local;
  int count_local;
  int location_local;
  int n_local;
  Functions *gl_local;
  
  switch(n) {
  case 1:
    (*gl->uniform1iv)(location,count,data);
    break;
  case 2:
    (*gl->uniform2iv)(location,count,data);
    break;
  case 3:
    (*gl->uniform3iv)(location,count,data);
    break;
  case 4:
    (*gl->uniform4iv)(location,count,data);
  }
  return;
}

Assistant:

static void uniformNiv (const glw::Functions& gl, int n, int location, int count, const int* data)
{
	switch (n)
	{
		case 1: gl.uniform1iv(location, count, data); break;
		case 2: gl.uniform2iv(location, count, data); break;
		case 3: gl.uniform3iv(location, count, data); break;
		case 4: gl.uniform4iv(location, count, data); break;
		default: DE_ASSERT(false);
	}
}